

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall mjs::parser::check_function_name(parser *this,wstring_view id,source_extend *extend)

{
  bool bVar1;
  wostream *pwVar2;
  wstring_view *s;
  wchar_t *in_R9;
  wstring_view name;
  wstring_view message;
  wstring local_210 [32];
  undefined1 local_1f0 [16];
  wstring local_1e0;
  wostringstream local_1b0 [8];
  wostringstream _oss;
  source_extend *extend_local;
  parser *this_local;
  wstring_view id_local;
  
  name._M_str = id._M_str;
  this_local = (parser *)id._M_len;
  name._M_len = (size_t)name._M_str;
  id_local._M_len = (size_t)name._M_str;
  bVar1 = is_strict_mode_unassignable_identifier((mjs *)this_local,name);
  if (!bVar1) {
    return;
  }
  std::__cxx11::wostringstream::wostringstream(local_1b0);
  pwVar2 = std::operator<<((wostream *)local_1b0,"\"");
  cpp_quote_abi_cxx11_(&local_1e0,(mjs *)&this_local,s);
  pwVar2 = std::operator<<(pwVar2,(wstring *)&local_1e0);
  std::operator<<(pwVar2,"\" may not be used as a function name in strict mode");
  std::__cxx11::wstring::~wstring((wstring *)&local_1e0);
  std::__cxx11::wostringstream::str();
  local_1f0 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_210);
  message._M_str = in_R9;
  message._M_len = local_1f0._8_8_;
  syntax_error((parser *)"check_function_name",(char *)0x2a9,(int)extend,local_1f0._0_8_,message);
}

Assistant:

void check_function_name(const std::wstring_view id, const source_extend& extend) {
        if (is_strict_mode_unassignable_identifier(id)) {
            SYNTAX_ERROR_AT("\"" << cpp_quote(id) << "\" may not be used as a function name in strict mode", extend);
        }
    }